

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O1

void BundleColorMap_SSE2(uint8_t *row,int width,int xbits,uint32_t *dst)

{
  short *psVar1;
  uint8_t *puVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [15];
  short sVar17;
  byte bVar18;
  byte bVar19;
  long lVar20;
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [13];
  undefined1 auVar27 [15];
  undefined2 uVar28;
  undefined4 uVar29;
  undefined6 uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  int width_00;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int5 iVar47;
  undefined1 auVar48 [16];
  undefined1 auVar52 [11];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [15];
  
  auVar14 = _DAT_0014eeb0;
  auVar39 = _DAT_0014a790;
  auVar36 = _DAT_00148230;
  auVar35 = _DAT_00148220;
  if (xbits == 0) {
    if (0xf < width) {
      uVar32 = 0;
      do {
        puVar2 = row + uVar32;
        bVar18 = puVar2[0xb];
        bVar19 = puVar2[0xd];
        auVar23[10] = 0;
        auVar23._0_10_ = SUB1610((undefined1  [16])0x0,0);
        auVar23[0xb] = puVar2[5];
        auVar24[9] = puVar2[4];
        auVar24._0_9_ = SUB169((undefined1  [16])0x0,0);
        auVar24._10_2_ = auVar23._10_2_;
        auVar25._9_3_ = auVar24._9_3_;
        auVar25._0_9_ = (unkuint9)0;
        auVar15._1_10_ = SUB1610(ZEXT516(CONCAT41(auVar25._8_4_,puVar2[3])) << 0x38,6);
        auVar15[0] = puVar2[2];
        auVar15._11_5_ = 0;
        auVar14._1_12_ = SUB1612(auVar15 << 0x28,4);
        auVar14[0] = puVar2[1];
        auVar14._13_3_ = 0;
        auVar39._1_14_ = SUB1614(auVar14 << 0x18,2);
        auVar39[0] = *puVar2;
        auVar39[0xf] = 0;
        auVar39 = auVar39 << 8;
        auVar9[0xd] = 0;
        auVar9._0_13_ = auVar39._0_13_;
        auVar9[0xe] = puVar2[3];
        auVar10[0xc] = 0;
        auVar10._0_12_ = auVar39._0_12_;
        auVar10._13_2_ = auVar9._13_2_;
        auVar11[0xb] = 0;
        auVar11._0_11_ = auVar39._0_11_;
        auVar11._12_3_ = auVar10._12_3_;
        auVar12[10] = puVar2[2];
        auVar12._0_10_ = auVar39._0_10_;
        auVar12._11_4_ = auVar11._11_4_;
        auVar13[9] = 0;
        auVar13._0_9_ = auVar39._0_9_;
        auVar13._10_5_ = auVar12._10_5_;
        auVar16[8] = 0;
        auVar16._0_8_ = auVar39._0_8_;
        auVar16._9_6_ = auVar13._9_6_;
        auVar21._7_8_ = 0;
        auVar21._0_7_ = auVar16._8_7_;
        auVar22._1_8_ = SUB158(auVar21 << 0x40,7);
        auVar22[0] = puVar2[1];
        auVar22._9_6_ = 0;
        auVar27._10_5_ = 0;
        auVar27._0_10_ = SUB1510(auVar22 << 0x30,5);
        auVar26._1_12_ = SUB1512(auVar27 << 0x28,3);
        auVar26[0] = *puVar2;
        auVar38._0_4_ = auVar26._0_4_ << 0x10;
        auVar38._8_4_ = auVar16._8_4_;
        auVar38._4_3_ = auVar10._12_3_;
        auVar38[7] = 0;
        auVar38._12_4_ = SUB154(auVar22 << 0x30,5) << 8;
        auVar39 = pshufhw(auVar38,auVar38,0xc4);
        auVar40._0_4_ = auVar39._0_4_;
        auVar40._8_4_ = auVar39._8_4_;
        auVar40._4_4_ = auVar39._12_4_;
        auVar40._12_4_ = auVar39._4_4_;
        auVar40 = auVar40 & auVar35;
        sVar3 = auVar40._0_2_;
        sVar4 = auVar40._2_2_;
        auVar41._0_2_ =
             CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar40[2] - (0xff < sVar4),
                      (0 < sVar3) * (sVar3 < 0x100) * auVar40[0] - (0xff < sVar3));
        sVar5 = auVar40._4_2_;
        sVar6 = auVar40._6_2_;
        auVar42._0_4_ =
             CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar40[6] - (0xff < sVar6),
                      CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar40[4] - (0xff < sVar5),
                               auVar41._0_2_));
        sVar7 = auVar40._8_2_;
        sVar8 = auVar40._10_2_;
        auVar43._0_6_ =
             CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar40[10] - (0xff < sVar8),
                      CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar40[8] - (0xff < sVar7),
                               auVar42._0_4_));
        sVar7 = auVar40._12_2_;
        sVar8 = auVar40._14_2_;
        auVar44._0_8_ =
             CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar40[0xe] - (0xff < sVar8),
                      CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar40[0xc] - (0xff < sVar7),
                               auVar43._0_6_));
        auVar45._0_10_ =
             CONCAT19((0 < sVar4) * (sVar4 < 0x100) * auVar40[2] - (0xff < sVar4),
                      CONCAT18((0 < sVar3) * (sVar3 < 0x100) * auVar40[0] - (0xff < sVar3),
                               auVar44._0_8_));
        auVar46[10] = (0 < sVar5) * (sVar5 < 0x100) * auVar40[4] - (0xff < sVar5);
        auVar46._0_10_ = auVar45._0_10_;
        auVar46[0xb] = (0 < sVar6) * (sVar6 < 0x100) * auVar40[6] - (0xff < sVar6);
        auVar46._12_2_ = (short)((ulong)auVar44._0_8_ >> 0x30);
        auVar46._14_2_ = 0xff00;
        auVar45._12_4_ = auVar46._12_4_;
        auVar45._10_2_ = 0xff00;
        auVar44._10_6_ = auVar45._10_6_;
        auVar44._8_2_ = (short)((uint6)auVar43._0_6_ >> 0x20);
        auVar43._8_8_ = auVar44._8_8_;
        auVar43._6_2_ = 0xff00;
        auVar42._6_10_ = auVar43._6_10_;
        auVar42._4_2_ = (short)((uint)auVar42._0_4_ >> 0x10);
        auVar41._4_12_ = auVar42._4_12_;
        auVar41._2_2_ = 0xff00;
        iVar47 = (uint5)CONCAT12(puVar2[9],(ushort)puVar2[8]) << 8;
        auVar49._0_6_ = CONCAT15(puVar2[10],iVar47);
        auVar50._0_10_ = CONCAT19(puVar2[0xc],(unkuint9)bVar18 << 0x38);
        auVar51[10] = 0;
        auVar51._0_10_ = auVar50._0_10_;
        auVar51[0xb] = bVar19;
        auVar52._0_10_ = (unkuint10)bVar19 << 0x30;
        auVar52[10] = puVar2[0xe];
        auVar53._11_3_ = 0;
        auVar53._0_11_ = auVar52;
        auVar53[0xe] = puVar2[0xf];
        auVar54._0_4_ = (uint)puVar2[0xc] << 0x10;
        auVar54._4_3_ = auVar53._12_3_;
        auVar54[7] = 0;
        auVar54._8_3_ = auVar52._8_3_;
        auVar54[0xb] = 0;
        auVar54._12_3_ = (int3)(((uint7)bVar19 << 0x30) >> 0x20);
        auVar54[0xf] = 0;
        auVar39 = pshuflw(auVar54,auVar54,0xc4);
        auVar55._0_4_ = auVar39._0_4_;
        auVar55._8_4_ = auVar39._8_4_;
        auVar55._4_4_ = auVar39._12_4_;
        auVar55._12_4_ = auVar39._4_4_;
        auVar39 = pshufhw(auVar55,auVar55,0xc6);
        auVar39 = auVar39 & auVar36;
        sVar3 = auVar39._0_2_;
        sVar4 = auVar39._2_2_;
        uVar28 = CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar39[2] - (0xff < sVar4),
                          (0 < sVar3) * (sVar3 < 0x100) * auVar39[0] - (0xff < sVar3));
        sVar3 = auVar39._4_2_;
        sVar4 = auVar39._6_2_;
        uVar29 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar39[6] - (0xff < sVar4),
                          CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar39[4] - (0xff < sVar3),
                                   uVar28));
        sVar3 = auVar39._8_2_;
        sVar4 = auVar39._10_2_;
        uVar30 = CONCAT15((0 < sVar4) * (sVar4 < 0x100) * auVar39[10] - (0xff < sVar4),
                          CONCAT14((0 < sVar3) * (sVar3 < 0x100) * auVar39[8] - (0xff < sVar3),
                                   uVar29));
        sVar3 = auVar39._12_2_;
        sVar4 = auVar39._14_2_;
        auVar51._12_2_ = (short)(((ulong)bVar18 << 0x38) >> 0x30);
        auVar51._14_2_ = 0xff00;
        auVar50._12_4_ = auVar51._12_4_;
        auVar50._10_2_ = 0xff00;
        auVar49._8_8_ =
             (undefined8)
             (CONCAT63(auVar50._10_6_,CONCAT21((short)((uint6)auVar49._0_6_ >> 0x20),bVar18)) >> 8);
        auVar49._6_2_ = 0xff00;
        auVar48._6_10_ = auVar49._6_10_;
        auVar48._4_2_ = (short)(CONCAT12(puVar2[9],(ushort)puVar2[8]) >> 8);
        auVar48._0_2_ = (undefined2)iVar47;
        auVar48._2_2_ = 0xff00;
        *(undefined1 (*) [16])dst = auVar41;
        *(short *)*(undefined1 (*) [16])((long)dst + 0x10) = auVar25._8_2_;
        *(undefined2 *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + 2) = 0;
        *(short *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + 4) = auVar23._10_2_;
        *(undefined2 *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + 6) = 0;
        *(undefined2 *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + 8) = 0;
        *(undefined2 *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + 10) = 0;
        *(undefined2 *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + 0xc) = 0;
        *(undefined2 *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + 0xe) = 0xff00;
        *(undefined1 (*) [16])((long)dst + 0x20) = auVar48;
        *(undefined2 *)*(undefined1 (*) [16])((long)dst + 0x30) = uVar28;
        *(undefined2 *)((long)*(undefined1 (*) [16])((long)dst + 0x30) + 2) = 0;
        *(short *)((long)*(undefined1 (*) [16])((long)dst + 0x30) + 4) =
             (short)((uint)uVar29 >> 0x10);
        *(undefined2 *)((long)*(undefined1 (*) [16])((long)dst + 0x30) + 6) = 0;
        *(short *)((long)*(undefined1 (*) [16])((long)dst + 0x30) + 8) =
             (short)((uint6)uVar30 >> 0x20);
        *(undefined2 *)((long)*(undefined1 (*) [16])((long)dst + 0x30) + 10) = 0;
        *(short *)((long)*(undefined1 (*) [16])((long)dst + 0x30) + 0xc) =
             (short)(CONCAT17((0 < sVar4) * (sVar4 < 0x100) * auVar39[0xe] - (0xff < sVar4),
                              CONCAT16((0 < sVar3) * (sVar3 < 0x100) * auVar39[0xc] - (0xff < sVar3)
                                       ,uVar30)) >> 0x30);
        *(undefined2 *)((long)*(undefined1 (*) [16])((long)dst + 0x30) + 0xe) = 0xff00;
        dst = (uint32_t *)((long)dst + 0x40);
        uVar33 = uVar32 + 0x10;
        uVar34 = uVar32 + 0x20;
        uVar32 = uVar33;
      } while (uVar34 <= (uint)width);
      goto LAB_0013e498;
    }
  }
  else if (xbits == 1) {
    if (0xf < width) {
      uVar32 = 0;
      do {
        psVar1 = (short *)(row + uVar32);
        sVar3 = psVar1[1];
        sVar4 = psVar1[2];
        sVar5 = psVar1[3];
        sVar6 = psVar1[4];
        sVar7 = psVar1[5];
        sVar8 = psVar1[6];
        sVar17 = psVar1[7];
        *(ushort *)*(undefined1 (*) [16])dst = *psVar1 * 0x110 & 0xff00;
        *(undefined2 *)((long)*(undefined1 (*) [16])dst + 2) = 0xff00;
        *(ushort *)((long)*(undefined1 (*) [16])dst + 4) = sVar3 * 0x110 & 0xff00;
        *(undefined2 *)((long)*(undefined1 (*) [16])dst + 6) = 0xff00;
        *(ushort *)((long)*(undefined1 (*) [16])dst + 8) = sVar4 * 0x110 & 0xff00;
        *(undefined2 *)((long)*(undefined1 (*) [16])dst + 10) = 0xff00;
        *(ushort *)((long)*(undefined1 (*) [16])dst + 0xc) = sVar5 * 0x110 & 0xff00;
        *(undefined2 *)((long)*(undefined1 (*) [16])dst + 0xe) = 0xff00;
        *(ushort *)*(undefined1 (*) [16])((long)dst + 0x10) = sVar6 * 0x110 & 0xff00;
        *(undefined2 *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + 2) = 0;
        *(ushort *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + 4) = sVar7 * 0x110 & 0xff00;
        *(undefined2 *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + 6) = 0;
        *(ushort *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + 8) = sVar8 * 0x110 & 0xff00;
        *(undefined2 *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + 10) = 0;
        *(ushort *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + 0xc) = sVar17 * 0x110 & 0xff00;
        *(undefined2 *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + 0xe) = 0xff00;
        dst = (uint32_t *)((long)dst + 0x20);
        uVar33 = uVar32 + 0x10;
        uVar34 = uVar32 + 0x20;
        uVar32 = uVar33;
      } while (uVar34 <= (uint)width);
      goto LAB_0013e498;
    }
  }
  else if (xbits == 2) {
    if (0xf < width) {
      uVar32 = 0;
      do {
        psVar1 = (short *)(row + uVar32);
        auVar36._0_2_ = *psVar1 * 0x104;
        auVar36._2_2_ = psVar1[1] * 0x104;
        auVar36._4_2_ = psVar1[2] * 0x104;
        auVar36._6_2_ = psVar1[3] * 0x104;
        auVar36._8_2_ = psVar1[4] * 0x104;
        auVar36._10_2_ = psVar1[5] * 0x104;
        auVar36._12_2_ = psVar1[6] * 0x104;
        auVar36._14_2_ = psVar1[7] * 0x104;
        auVar36 = auVar36 & auVar14;
        auVar37._0_4_ = auVar36._0_4_ >> 0xc;
        auVar37._4_4_ = auVar36._4_4_ >> 0xc;
        auVar37._8_4_ = auVar36._8_4_ >> 0xc;
        auVar37._12_4_ = auVar36._12_4_ >> 0xc;
        *(undefined1 (*) [16])((long)dst + uVar32) = auVar37 | auVar36 | auVar39;
        uVar33 = uVar32 + 0x10;
        uVar34 = uVar32 + 0x20;
        uVar32 = uVar33;
      } while (uVar34 <= (uint)width);
      dst = (uint32_t *)((long)dst + uVar33);
      goto LAB_0013e498;
    }
  }
  else if (0xf < width) {
    uVar32 = 0;
    do {
      lVar20 = *(long *)((long)(row + uVar32) + 8);
      auVar35._0_8_ = *(long *)(row + uVar32) << 7;
      auVar35._8_8_ = lVar20 << 7;
      uVar31 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                              (ushort)((byte)lVar20 & 1) << 8 |
                              (ushort)((byte)(auVar35._8_8_ >> 0xf) & 1) << 9 |
                              (ushort)((byte)(auVar35._8_8_ >> 0x17) & 1) << 10 |
                              (ushort)((byte)(auVar35._8_8_ >> 0x1f) & 1) << 0xb |
                              (ushort)((byte)(auVar35._8_8_ >> 0x27) & 1) << 0xc |
                              (ushort)((byte)(auVar35._8_8_ >> 0x2f) & 1) << 0xd |
                              (ushort)((byte)(auVar35._8_8_ >> 0x37) & 1) << 0xe |
                             (ushort)(byte)(auVar35._8_8_ >> 0x3f) << 0xf);
      *(uint *)*(undefined1 (*) [16])dst = (uVar31 & 0xff) << 8 | 0xff000000;
      *(uint *)((long)*(undefined1 (*) [16])dst + 4) = uVar31 & 0xff00 | 0xff000000;
      dst = (uint32_t *)((long)*(undefined1 (*) [16])dst + 8);
      uVar33 = uVar32 + 0x10;
      uVar34 = uVar32 + 0x20;
      uVar32 = uVar33;
    } while (uVar34 <= (uint)width);
    goto LAB_0013e498;
  }
  uVar33 = 0;
LAB_0013e498:
  width_00 = width - (int)uVar33;
  if (width_00 != 0) {
    VP8LBundleColorMap_C(row + (uVar33 & 0xffffffff),width_00,xbits,dst);
    return;
  }
  return;
}

Assistant:

static void BundleColorMap_SSE2(const uint8_t* const row, int width, int xbits,
                                uint32_t* dst) {
  int x;
  assert(xbits >= 0);
  assert(xbits <= 3);
  switch (xbits) {
    case 0: {
      const __m128i ff = _mm_set1_epi16((short)0xff00);
      const __m128i zero = _mm_setzero_si128();
      // Store 0xff000000 | (row[x] << 8).
      for (x = 0; x + 16 <= width; x += 16, dst += 16) {
        const __m128i in = _mm_loadu_si128((const __m128i*)&row[x]);
        const __m128i in_lo = _mm_unpacklo_epi8(zero, in);
        const __m128i dst0 = _mm_unpacklo_epi16(in_lo, ff);
        const __m128i dst1 = _mm_unpackhi_epi16(in_lo, ff);
        const __m128i in_hi = _mm_unpackhi_epi8(zero, in);
        const __m128i dst2 = _mm_unpacklo_epi16(in_hi, ff);
        const __m128i dst3 = _mm_unpackhi_epi16(in_hi, ff);
        _mm_storeu_si128((__m128i*)&dst[0], dst0);
        _mm_storeu_si128((__m128i*)&dst[4], dst1);
        _mm_storeu_si128((__m128i*)&dst[8], dst2);
        _mm_storeu_si128((__m128i*)&dst[12], dst3);
      }
      break;
    }
    case 1: {
      const __m128i ff = _mm_set1_epi16((short)0xff00);
      const __m128i mul = _mm_set1_epi16(0x110);
      for (x = 0; x + 16 <= width; x += 16, dst += 8) {
        // 0a0b | (where a/b are 4 bits).
        const __m128i in = _mm_loadu_si128((const __m128i*)&row[x]);
        const __m128i tmp = _mm_mullo_epi16(in, mul);  // aba0
        const __m128i pack = _mm_and_si128(tmp, ff);   // ab00
        const __m128i dst0 = _mm_unpacklo_epi16(pack, ff);
        const __m128i dst1 = _mm_unpackhi_epi16(pack, ff);
        _mm_storeu_si128((__m128i*)&dst[0], dst0);
        _mm_storeu_si128((__m128i*)&dst[4], dst1);
      }
      break;
    }
    case 2: {
      const __m128i mask_or = _mm_set1_epi32(0xff000000);
      const __m128i mul_cst = _mm_set1_epi16(0x0104);
      const __m128i mask_mul = _mm_set1_epi16(0x0f00);
      for (x = 0; x + 16 <= width; x += 16, dst += 4) {
        // 000a000b000c000d | (where a/b/c/d are 2 bits).
        const __m128i in = _mm_loadu_si128((const __m128i*)&row[x]);
        const __m128i mul = _mm_mullo_epi16(in, mul_cst);  // 00ab00b000cd00d0
        const __m128i tmp = _mm_and_si128(mul, mask_mul);  // 00ab000000cd0000
        const __m128i shift = _mm_srli_epi32(tmp, 12);     // 00000000ab000000
        const __m128i pack = _mm_or_si128(shift, tmp);     // 00000000abcd0000
        // Convert to 0xff00**00.
        const __m128i res = _mm_or_si128(pack, mask_or);
        _mm_storeu_si128((__m128i*)dst, res);
      }
      break;
    }
    default: {
      assert(xbits == 3);
      for (x = 0; x + 16 <= width; x += 16, dst += 2) {
        // 0000000a00000000b... | (where a/b are 1 bit).
        const __m128i in = _mm_loadu_si128((const __m128i*)&row[x]);
        const __m128i shift = _mm_slli_epi64(in, 7);
        const uint32_t move = _mm_movemask_epi8(shift);
        dst[0] = 0xff000000 | ((move & 0xff) << 8);
        dst[1] = 0xff000000 | (move & 0xff00);
      }
      break;
    }
  }
  if (x != width) {
    VP8LBundleColorMap_C(row + x, width - x, xbits, dst);
  }
}